

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

ma_result ma_paged_audio_buffer_data_append_page
                    (ma_paged_audio_buffer_data *pData,ma_paged_audio_buffer_page *pPage)

{
  ma_paged_audio_buffer_page *pmVar1;
  ma_result mVar2;
  ma_paged_audio_buffer_page *pmVar3;
  bool bVar4;
  
  mVar2 = MA_INVALID_ARGS;
  if (pPage != (ma_paged_audio_buffer_page *)0x0 && pData != (ma_paged_audio_buffer_data *)0x0) {
    do {
      pmVar1 = pData->pTail;
      LOCK();
      pmVar3 = pData->pTail;
      bVar4 = pmVar1 == pmVar3;
      if (bVar4) {
        pData->pTail = pPage;
        pmVar3 = pmVar1;
      }
      UNLOCK();
    } while (!bVar4);
    LOCK();
    pmVar3->pNext = pPage;
    UNLOCK();
    mVar2 = MA_SUCCESS;
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_paged_audio_buffer_data_append_page(ma_paged_audio_buffer_data* pData, ma_paged_audio_buffer_page* pPage)
{
    if (pData == NULL || pPage == NULL) {
        return MA_INVALID_ARGS;
    }

    /* This function assumes the page has been filled with audio data by this point. As soon as we append, the page will be available for reading. */

    /* First thing to do is update the tail. */
    for (;;) {
        ma_paged_audio_buffer_page* pOldTail = (ma_paged_audio_buffer_page*)c89atomic_load_ptr(&pData->pTail);
        ma_paged_audio_buffer_page* pNewTail = pPage;

        if (c89atomic_compare_exchange_weak_ptr((volatile void**)&pData->pTail, (void**)&pOldTail, pNewTail)) {
            /* Here is where we append the page to the list. After this, the page is attached to the list and ready to be read from. */
            c89atomic_exchange_ptr(&pOldTail->pNext, pPage);
            break;  /* Done. */
        }
    }

    return MA_SUCCESS;
}